

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O2

void __thiscall
spvtools::opt::IRContext::CollectCallTreeFromRoots
          (IRContext *this,uint entryId,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *funcs)

{
  Function *func;
  IRContext *this_00;
  uint32_t fi;
  queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> roots;
  uint32_t local_78;
  uint local_74;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  
  local_74 = entryId;
  std::queue<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
  queue<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>
            ((queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &local_70);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70,&local_74);
  while (local_70._M_impl.super__Deque_impl_data._M_finish._M_cur !=
         local_70._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_78 = *local_70._M_impl.super__Deque_impl_data._M_start._M_cur;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_front
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
    std::__detail::
    _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)funcs,&local_78);
    this_00 = this;
    func = GetFunction(this,local_78);
    AddCalls(this_00,func,
             (queue<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *)
             &local_70);
  }
  std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base(&local_70);
  return;
}

Assistant:

void IRContext::CollectCallTreeFromRoots(unsigned entryId,
                                         std::unordered_set<uint32_t>* funcs) {
  std::queue<uint32_t> roots;
  roots.push(entryId);
  while (!roots.empty()) {
    const uint32_t fi = roots.front();
    roots.pop();
    funcs->insert(fi);
    Function* fn = GetFunction(fi);
    AddCalls(fn, &roots);
  }
}